

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void size_class(sc_t *sc,int lg_max_lookup,int lg_page,int lg_ngroup,int index,int lg_base,
               int lg_delta,int ndelta)

{
  ulong uVar1;
  ulong uVar2;
  
  sc->index = lg_max_lookup;
  sc->lg_base = lg_page;
  sc->lg_delta = lg_ngroup;
  sc->ndelta = index;
  uVar2 = ((long)index << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lg_page & 0x3f));
  sc->psz = (uVar2 & 0xfff) == 0;
  if (uVar2 < 0x4000) {
    sc->bin = true;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 0x1000;
    } while (uVar1 % uVar2 != 0);
    sc->pgs = (int)(uVar1 >> 0xc);
    if (uVar2 < 0x1001) goto LAB_01d7bb15;
  }
  else {
    sc->bin = false;
    sc->pgs = 0;
  }
  lg_ngroup = 0;
LAB_01d7bb15:
  sc->lg_delta_lookup = lg_ngroup;
  return;
}

Assistant:

static void
size_class(
    /* Output. */
    sc_t *sc,
    /* Configuration decisions. */
    int lg_max_lookup, int lg_page, int lg_ngroup,
    /* Inputs specific to the size class. */
    int index, int lg_base, int lg_delta, int ndelta) {
	sc->index = index;
	sc->lg_base = lg_base;
	sc->lg_delta = lg_delta;
	sc->ndelta = ndelta;
	size_t size = reg_size_compute(lg_base, lg_delta, ndelta);
	sc->psz = (size % (ZU(1) << lg_page) == 0);
	if (index == 0) {
		assert(!sc->psz);
	}
	if (size < (ZU(1) << (lg_page + lg_ngroup))) {
		sc->bin = true;
		sc->pgs = slab_size(lg_page, lg_base, lg_delta, ndelta);
	} else {
		sc->bin = false;
		sc->pgs = 0;
	}
	if (size <= (ZU(1) << lg_max_lookup)) {
		sc->lg_delta_lookup = lg_delta;
	} else {
		sc->lg_delta_lookup = 0;
	}
}